

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# active.cc
# Opt level: O3

base_learner * active_setup(options_i *options,vw *all)

{
  _func_int **pp_Var1;
  undefined4 uVar2;
  vw *all_00;
  int iVar3;
  active *paVar4;
  option_group_definition *poVar5;
  typed_option<float> *op;
  base_learner *l;
  single_learner *__src;
  learner<active,_example> *__dest;
  vw_exception *this;
  bool active_option;
  bool simulation;
  size_type __dnew_2;
  option_group_definition new_options;
  size_type __dnew;
  size_type __dnew_1;
  stringstream __msg;
  bool local_44a;
  bool local_449;
  active *local_448;
  vw *local_440;
  long local_438;
  _func_int ***local_430;
  _func_int **local_428;
  _func_int **local_420 [2];
  _func_int ***local_410;
  _func_int **local_408;
  _func_int **local_400 [2];
  string local_3f0;
  option_group_definition local_3d0;
  long *local_398;
  long local_390;
  long local_388 [2];
  string local_378;
  string local_358;
  undefined7 *local_338;
  undefined8 local_330;
  undefined7 local_328;
  undefined1 uStack_321;
  undefined7 uStack_320;
  undefined1 local_319;
  string local_318;
  undefined1 local_2f8 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_270;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_260;
  typed_option<float> local_258;
  undefined1 local_1b8 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0;
  string local_188 [64];
  bool local_148;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_130;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_120;
  
  local_440 = all;
  paVar4 = calloc_or_throw<active>(1);
  *(undefined8 *)paVar4 = 0;
  paVar4->all = (vw *)0x0;
  local_44a = false;
  local_449 = false;
  uStack_320 = 0x676e696e726165;
  local_328 = 0x20657669746341;
  uStack_321 = 0x4c;
  local_330 = 0xf;
  local_319 = 0;
  local_3d0.m_name._M_dataplus._M_p = (pointer)&local_3d0.m_name.field_2;
  local_448 = paVar4;
  local_338 = &local_328;
  std::__cxx11::string::_M_construct<char*>((string *)&local_3d0,&local_328);
  local_3d0.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_3d0.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3d0.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_338 != &local_328) {
    operator_delete(local_338);
  }
  local_3f0._M_dataplus._M_p = (pointer)&local_3f0.field_2;
  local_3f0.field_2._M_allocated_capacity._0_4_ = 0x69746361;
  local_3f0.field_2._M_allocated_capacity._4_2_ = 0x6576;
  local_3f0._M_string_length = 6;
  local_3f0.field_2._M_local_buf[6] = '\0';
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_1b8,&local_3f0,&local_44a);
  local_148 = true;
  local_410 = local_400;
  local_2f8._0_8_ = (_func_int **)0x16;
  local_410 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_410,(ulong)local_2f8);
  local_400[0] = (_func_int **)local_2f8._0_8_;
  *local_410 = (_func_int **)0x6120656c62616e65;
  local_410[1] = (_func_int **)0x656c206576697463;
  builtin_strncpy((char *)((long)local_410 + 0xe),"learning",8);
  local_408 = (_func_int **)local_2f8._0_8_;
  *(char *)((long)local_410 + local_2f8._0_8_) = '\0';
  std::__cxx11::string::_M_assign(local_188);
  poVar5 = VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
                     (&local_3d0,(typed_option<bool> *)local_1b8);
  local_358.field_2._M_allocated_capacity = 0x6974616c756d6973;
  local_358.field_2._8_2_ = 0x6e6f;
  local_358._M_string_length = 10;
  local_358.field_2._M_local_buf[10] = '\0';
  local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_2f8,&local_358,&local_449);
  local_430 = local_420;
  local_258.super_base_option._vptr_base_option = (_func_int **)0x1f;
  local_430 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_430,(ulong)&local_258);
  local_420[0] = local_258.super_base_option._vptr_base_option;
  builtin_strncpy((char *)((long)local_430 + 0xf)," simulat",8);
  builtin_strncpy((char *)((long)local_430 + 0x17),"ion mode",8);
  *local_430 = (_func_int **)0x6c20657669746361;
  local_430[1] = (_func_int **)0x20676e696e726165;
  local_428 = local_258.super_base_option._vptr_base_option;
  *(char *)((long)local_430 + (long)local_258.super_base_option._vptr_base_option) = '\0';
  std::__cxx11::string::_M_assign((string *)(local_2f8 + 0x30));
  poVar5 = VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
                     (poVar5,(typed_option<bool> *)local_2f8);
  local_378.field_2._M_allocated_capacity = 0x656e776f6c6c656d;
  local_378.field_2._8_2_ = 0x7373;
  local_378._M_string_length = 10;
  local_378.field_2._M_local_buf[10] = '\0';
  local_378._M_dataplus._M_p = (pointer)&local_378.field_2;
  VW::config::typed_option<float>::typed_option(&local_258,&local_378,&paVar4->active_c0);
  op = VW::config::typed_option<float>::default_value(&local_258,8.0);
  local_438 = 0x33;
  local_398 = local_388;
  local_398 = (long *)std::__cxx11::string::_M_create((ulong *)&local_398,(ulong)&local_438);
  local_388[0] = local_438;
  local_398[4] = 0x305f632072657465;
  local_398[5] = 0x6c7561666544202e;
  local_398[2] = 0x656e776f6c6c656d;
  local_398[3] = 0x6d61726170207373;
  *local_398 = 0x6c20657669746361;
  local_398[1] = 0x20676e696e726165;
  builtin_strncpy((char *)((long)local_398 + 0x2f),"lt 8",4);
  local_390 = local_438;
  *(char *)((long)local_398 + local_438) = '\0';
  std::__cxx11::string::_M_assign((string *)&(op->super_base_option).m_help);
  VW::config::option_group_definition::add<VW::config::typed_option<float>&>(poVar5,op);
  if (local_398 != local_388) {
    operator_delete(local_398);
  }
  local_258.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002dd238;
  if (local_258.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_258.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_258.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_258.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_258.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_378._M_dataplus._M_p != &local_378.field_2) {
    operator_delete(local_378._M_dataplus._M_p);
  }
  if (local_430 != local_420) {
    operator_delete(local_430);
  }
  local_2f8._0_8_ = &PTR__typed_option_002dd128;
  if (local_260._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_260._M_pi);
  }
  if (local_270._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_270._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_2f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_358._M_dataplus._M_p != &local_358.field_2) {
    operator_delete(local_358._M_dataplus._M_p);
  }
  if (local_410 != local_400) {
    operator_delete(local_410);
  }
  local_1b8._0_8_ = &PTR__typed_option_002dd128;
  if (local_120._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_120._M_pi);
  }
  paVar4 = local_448;
  if (local_130._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_130._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_1b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f0._M_dataplus._M_p != &local_3f0.field_2) {
    operator_delete(local_3f0._M_dataplus._M_p);
  }
  (**options->_vptr_options_i)(options,&local_3d0);
  all_00 = local_440;
  if (local_44a == false) {
    __dest = (learner<active,_example> *)0x0;
  }
  else {
    paVar4->all = local_440;
    pp_Var1 = (_func_int **)(local_1b8 + 0x10);
    local_1b8._16_4_ = 0x61646c;
    local_1b8._8_8_ = (pointer)0x3;
    local_1b8._0_8_ = pp_Var1;
    iVar3 = (*options->_vptr_options_i[1])(options,local_1b8);
    if ((_func_int **)local_1b8._0_8_ != pp_Var1) {
      operator_delete((void *)local_1b8._0_8_);
    }
    if ((char)iVar3 != '\0') {
      std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_1b8 + 0x10),"error: you can\'t combine lda and active learning",
                 0x30);
      this = (vw_exception *)__cxa_allocate_exception(0x38);
      std::__cxx11::stringbuf::str();
      VW::vw_exception::vw_exception
                (this,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/active.cc"
                 ,0xa0,&local_318);
      __cxa_throw(this,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    l = setup_base(options,all_00);
    __src = LEARNER::as_singleline<char,char>(l);
    local_1b8._16_8_ = 0x6974616c756d6973;
    local_1a0._M_allocated_capacity._0_2_ = 0x6e6f;
    local_1b8._8_8_ = (pointer)0xa;
    local_1a0._M_local_buf[2] = '\0';
    local_1b8._0_8_ = pp_Var1;
    iVar3 = (*options->_vptr_options_i[1])(options);
    if ((_func_int **)local_1b8._0_8_ != pp_Var1) {
      operator_delete((void *)local_1b8._0_8_);
    }
    if ((char)iVar3 == '\0') {
      all_00->active = true;
      uVar2 = *(undefined4 *)(__src + 0xd0);
      __dest = calloc_or_throw<LEARNER::learner<active,example>>(1);
      memcpy(__dest,__src,0xe9);
      *(single_learner **)(__dest + 0x20) = __src;
      *(code **)(__dest + 0x50) = LEARNER::recur_sensitivity;
      *(active **)(__dest + 0xb8) = local_448;
      *(single_learner **)(__dest + 0xc0) = __src;
      *(code **)(__dest + 200) = LEARNER::noop;
      *(undefined8 *)(__dest + 0xd8) = 1;
      *(undefined8 *)(__dest + 0xe0) = *(undefined8 *)(__src + 0xe0);
      *(active **)(__dest + 0x18) = local_448;
      *(code **)(__dest + 0x28) = predict_or_learn_active<true>;
      *(code **)(__dest + 0x38) = predict_or_learn_active<true>;
      *(code **)(__dest + 0x30) = predict_or_learn_active<false>;
      *(undefined8 *)(__dest + 0x40) = 0;
      *(undefined4 *)(__dest + 0xd0) = uVar2;
      __dest[0xe8] = (learner<active,_example>)0x0;
      *(active **)(__dest + 0x58) = local_448;
      *(code **)(__dest + 0x68) = return_active_example;
    }
    else {
      uVar2 = *(undefined4 *)(__src + 0xd0);
      __dest = calloc_or_throw<LEARNER::learner<active,example>>(1);
      memcpy(__dest,__src,0xe9);
      *(single_learner **)(__dest + 0x20) = __src;
      *(code **)(__dest + 0x50) = LEARNER::recur_sensitivity;
      *(active **)(__dest + 0xb8) = local_448;
      *(single_learner **)(__dest + 0xc0) = __src;
      *(code **)(__dest + 200) = LEARNER::noop;
      *(undefined8 *)(__dest + 0xd8) = 1;
      *(undefined8 *)(__dest + 0xe0) = *(undefined8 *)(__src + 0xe0);
      *(active **)(__dest + 0x18) = local_448;
      *(code **)(__dest + 0x28) = predict_or_learn_simulation<true>;
      *(code **)(__dest + 0x38) = predict_or_learn_simulation<true>;
      *(code **)(__dest + 0x30) = predict_or_learn_simulation<false>;
      *(undefined8 *)(__dest + 0x40) = 0;
      *(undefined4 *)(__dest + 0xd0) = uVar2;
      __dest[0xe8] = (learner<active,_example>)0x0;
    }
    paVar4 = (active *)0x0;
  }
  std::
  vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ::~vector(&local_3d0.m_options);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0.m_name._M_dataplus._M_p != &local_3d0.m_name.field_2) {
    operator_delete(local_3d0.m_name._M_dataplus._M_p);
  }
  if (paVar4 != (active *)0x0) {
    free(paVar4);
  }
  return (base_learner *)__dest;
}

Assistant:

base_learner* active_setup(options_i& options, vw& all)
{
  auto data = scoped_calloc_or_throw<active>();

  bool active_option = false;
  bool simulation = false;
  option_group_definition new_options("Active Learning");
  new_options.add(make_option("active", active_option).keep().help("enable active learning"))
      .add(make_option("simulation", simulation).help("active learning simulation mode"))
      .add(make_option("mellowness", data->active_c0)
               .default_value(8.f)
               .help("active learning mellowness parameter c_0. Default 8"));
  options.add_and_parse(new_options);

  if (!active_option)
    return nullptr;

  data->all = &all;

  if (options.was_supplied("lda"))
    THROW("error: you can't combine lda and active learning");

  auto base = as_singleline(setup_base(options, all));

  // Create new learner
  learner<active, example>* l;
  if (options.was_supplied("simulation"))
    l = &init_learner(data, base, predict_or_learn_simulation<true>, predict_or_learn_simulation<false>);
  else
  {
    all.active = true;
    l = &init_learner(data, base, predict_or_learn_active<true>, predict_or_learn_active<false>);
    l->set_finish_example(return_active_example);
  }

  return make_base(*l);
}